

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddTransactionOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string)

{
  ConfidentialTransactionContext *this;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_262;
  bool is_bitcoin;
  ConfidentialAssetId asset;
  Amount amount;
  string local_228;
  ConfidentialNonce nonce;
  ElementsConfidentialAddress confidential_addr;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&confidential_addr,"TransactionData",(allocator *)&asset);
  cfd::capi::CheckBuffer(create_handle,(string *)&confidential_addr);
  std::__cxx11::string::~string((string *)&confidential_addr);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  cfd::core::Amount::Amount(&amount,value_satoshi);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&confidential_addr,"Invalid handle state. tx is null",(allocator *)&asset);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&confidential_addr)
    ;
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    bVar1 = cfd::capi::IsEmptyString(address);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
      if (bVar1) {
        return 0;
      }
      std::__cxx11::string::string((string *)&asset,direct_locking_script,(allocator *)&nonce);
      cfd::core::Script::Script((Script *)&confidential_addr,(string *)&asset);
      cfd::core::Transaction::AddTxOut((Transaction *)this,&amount,(Script *)&confidential_addr);
      cfd::core::Script::~Script((Script *)&confidential_addr);
    }
    else {
      std::__cxx11::string::string((string *)&asset,address,(allocator *)&nonce);
      cfd::core::Address::Address(&confidential_addr.unblinded_address_,(string *)&asset);
      (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
        [0x12])(this,&confidential_addr,&amount);
      cfd::core::Address::~Address(&confidential_addr.unblinded_address_);
    }
    std::__cxx11::string::~string((string *)&asset);
  }
  else {
    bVar1 = cfd::capi::IsEmptyString(asset_string);
    if (bVar1) {
      confidential_addr.unblinded_address_._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
           + 0x56;
      confidential_addr.unblinded_address_.witness_ver_ = 0x172;
      confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdAddTransactionOutput";
      cfd::core::logger::warn<>((CfdSourceLocation *)&confidential_addr,"asset is null or empty.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&confidential_addr,"Failed to parameter. asset is null or empty.",
                 (allocator *)&asset);
      cfd::core::CfdException::CfdException
                (pCVar2,kCfdIllegalArgumentError,(string *)&confidential_addr);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&confidential_addr,asset_string,(allocator *)&nonce);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&confidential_addr);
    std::__cxx11::string::~string((string *)&confidential_addr);
    bVar1 = cfd::capi::IsEmptyString(address);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
      if (bVar1) {
        cfd::ConfidentialTransactionContext::UpdateFeeAmount(this,&amount,&asset);
      }
      else {
        cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce);
        std::__cxx11::string::string((string *)&local_228,direct_locking_script,&local_262);
        cfd::core::Script::Script((Script *)&confidential_addr,&local_228);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (&this->super_ConfidentialTransaction,&amount,&asset,(Script *)&confidential_addr,
                   &nonce);
        cfd::core::Script::~Script((Script *)&confidential_addr);
        std::__cxx11::string::~string((string *)&local_228);
        cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce);
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&nonce);
      std::__cxx11::string::string((string *)&confidential_addr,address,(allocator *)&local_228);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress
                        ((string *)&confidential_addr);
      std::__cxx11::string::~string((string *)&confidential_addr);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_228,address,&local_262);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  (&confidential_addr,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
          [0x13])(this,&confidential_addr,&amount,&asset,0);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_addr);
      }
      else {
        std::__cxx11::string::string((string *)&local_228,address,&local_262);
        cfd::AddressFactory::GetAddress
                  (&confidential_addr.unblinded_address_,(AddressFactory *)&nonce,&local_228);
        (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
          [0x12])(this,&confidential_addr,&amount,&asset);
        cfd::core::Address::~Address(&confidential_addr.unblinded_address_);
        std::__cxx11::string::~string((string *)&local_228);
      }
      cfd::AddressFactory::~AddressFactory((AddressFactory *)&nonce);
    }
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  }
  return 0;
}

Assistant:

int CfdAddTransactionOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount amount = Amount(value_satoshi);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(address)) {
        tx->AddTxOut(Address(address), amount);
      } else if (!IsEmptyString(direct_locking_script)) {
        tx->AddTxOut(amount, Script(direct_locking_script));
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (IsEmptyString(asset_string)) {
        warn(CFD_LOG_SOURCE, "asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. asset is null or empty.");
      }
      ConfidentialAssetId asset = ConfidentialAssetId(asset_string);

      if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
          ElementsConfidentialAddress confidential_addr(address);
          tx->AddTxOut(confidential_addr, amount, asset, false);
        } else {
          tx->AddTxOut(address_factory.GetAddress(address), amount, asset);
        }
      } else if (!IsEmptyString(direct_locking_script)) {
        ConfidentialNonce nonce;
        tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce);
      } else {
        tx->UpdateFeeAmount(amount, asset);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}